

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command.cpp
# Opt level: O2

void __thiscall Command_NoCalls_Test::Command_NoCalls_Test(Command_NoCalls_Test *this)

{
  anon_unknown.dwarf_21ba7::Command::Command(&this->super_Command);
  (this->super_Command).super_Test._vptr_Test = (_func_int **)&PTR__Command_00189408;
  return;
}

Assistant:

TEST_F (Command, NoCalls) {
    using ::testing::_;
    EXPECT_CALL (cp (), suicide (_, _)).Times (0);
    EXPECT_CALL (cp (), quit (_, _)).Times (0);
    EXPECT_CALL (cp (), cquit (_, _)).Times (0);
    EXPECT_CALL (cp (), gc (_, _)).Times (0);
    EXPECT_CALL (cp (), echo (_, _)).Times (0);
    EXPECT_CALL (cp (), nop (_, _)).Times (0);
}